

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scavenger.cpp
# Opt level: O0

void __thiscall pstore::broker::scavenger::thread_entry(scavenger *this)

{
  bool bVar1;
  element_type *this_00;
  double __x;
  double __x_00;
  double __x_01;
  not_null<const_char_*> local_70 [2];
  exception *ex;
  not_null<const_char_*> local_58;
  undefined1 local_50 [8];
  shared_ptr<pstore::broker::command_processor> scp;
  duration<long,_std::ratio<1L,_1L>_> local_38;
  seconds sleep_time;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  scavenger *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->mut_);
  local_38.__r = 600;
  while( true ) {
    std::condition_variable::wait_for<long,std::ratio<1l,1l>>
              (&this->cv_,(unique_lock<std::mutex> *)local_20,&local_38);
    pstore::gsl::not_null<const_char_*>::not_null
              ((not_null<const_char_*> *)
               &scp.
                super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,"begin scavenging");
    log((pstore *)0x6,__x);
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)&done);
    if (bVar1) break;
    std::weak_ptr<pstore::broker::command_processor>::lock
              ((weak_ptr<pstore::broker::command_processor> *)local_50);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_50);
    if (bVar1) {
      this_00 = std::
                __shared_ptr_access<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_50);
      command_processor::scavenge(this_00);
    }
    std::shared_ptr<pstore::broker::command_processor>::~shared_ptr
              ((shared_ptr<pstore::broker::command_processor> *)local_50);
    pstore::gsl::not_null<const_char_*>::not_null(&local_58,"scavenging done");
    log((pstore *)0x6,__x_00);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  pstore::gsl::not_null<const_char_*>::not_null(local_70,"scavenger thread exiting");
  log((pstore *)0x6,__x_01);
  return;
}

Assistant:

void scavenger::thread_entry () {
            try {
                std::unique_lock<decltype (mut_)> lock (mut_);
                auto const sleep_time =
                    std::chrono::seconds (10 * 60); // TODO: make this configurable by the user.
                for (;;) {
                    cv_.wait_for (lock, sleep_time);
                    log (logger::priority::info, "begin scavenging");
                    if (done) {
                        break;
                    }

                    // If the command processor still exists, ask it to scavenge any stale records.
                    if (auto const scp = cp_.lock ()) {
                        scp->scavenge ();
                    }

                    log (logger::priority::info, "scavenging done");
                }
            } catch (std::exception const & ex) {
                log (logger::priority::error, "error:", ex.what ());
            } catch (...) {
                log (logger::priority::error, "unknown exception");
            }
            log (logger::priority::info, "scavenger thread exiting");
        }